

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O0

size_t __thiscall Apt::AddTaxiEdge(Apt *this,size_t n1,size_t n2,edgeTy _type)

{
  bool bVar1;
  logLevelTy lVar2;
  reference this_00;
  reference __args;
  size_type sVar3;
  undefined4 in_ECX;
  double in_RDX;
  double in_RSI;
  double *in_RDI;
  unsigned_long *__args_1;
  unsigned_long *__args_2;
  size_t eIdx;
  TaxiNode *b;
  TaxiNode *a;
  double in_stack_ffffffffffffff98;
  TaxiNode *in_stack_ffffffffffffffa0;
  double *lat2;
  double *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffd8;
  double *lat1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_8;
  
  lat1 = in_RDI;
  this_00 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::at
                      ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)in_stack_ffffffffffffffa0,
                       (size_type)in_stack_ffffffffffffff98);
  __args = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::at
                     ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)in_stack_ffffffffffffffa0,
                      (size_type)in_stack_ffffffffffffff98);
  bVar1 = TaxiNode::HasGeoCoords(in_stack_ffffffffffffffa0);
  if ((bVar1) && (bVar1 = TaxiNode::HasGeoCoords(in_stack_ffffffffffffffa0), bVar1)) {
    lat2 = in_RDI + 0x1d;
    __args_1 = (unsigned_long *)
               CoordAngle((double)lat1,in_RSI,in_RDX,
                          (double)CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
    __args_2 = (unsigned_long *)
               DistLatLon((double)in_stack_ffffffffffffffb0,(double)in_RDI,(double)lat2,
                          in_stack_ffffffffffffff98);
    std::vector<TaxiEdge,std::allocator<TaxiEdge>>::
    emplace_back<TaxiEdge::edgeTy&,unsigned_long&,unsigned_long&,double,double>
              ((vector<TaxiEdge,_std::allocator<TaxiEdge>_> *)this_00,(edgeTy *)__args,__args_1,
               __args_2,in_stack_ffffffffffffffb0,in_RDI);
    sVar3 = std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>::size
                      ((vector<TaxiEdge,_std::allocator<TaxiEdge>_> *)(in_RDI + 0x1d));
    local_8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(sVar3 - 1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (local_8,(value_type_conflict2 *)in_RDI);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (local_8,(value_type_conflict2 *)in_RDI);
  }
  else {
    lVar2 = DataRefs::GetLogLevel(&dataRefs);
    if ((int)lVar2 < 1) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
             ,0x1f2,"AddTaxiEdge",logDEBUG,"apt.dat: Node %lu or %lu invalid! Edge not added.",
             in_RSI,in_RDX);
    }
    local_8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xffffffffffffffff;
  }
  return (size_t)local_8;
}

Assistant:

size_t AddTaxiEdge (size_t n1, size_t n2,
                        TaxiEdge::edgeTy _type = TaxiEdge::TAXI_WAY)
    {
        // Actual nodes must be valid, throws exception if not
        TaxiNode& a = vecTaxiNodes.at(n1);
        TaxiNode& b = vecTaxiNodes.at(n2);
        if (!a.HasGeoCoords() || !b.HasGeoCoords())
        {
            LOG_MSG(logDEBUG, "apt.dat: Node %lu or %lu invalid! Edge not added.",
                    (long unsigned)n1, (long unsigned)n2);
            return ULONG_MAX;
        }
        
        // Add the edge
        vecTaxiEdges.emplace_back(_type, n1, n2,
                                  CoordAngle(a.lat, a.lon, b.lat, b.lon),
                                  DistLatLon(a.lat, a.lon, b.lat, b.lon));
        
        // Tell the nodes they've got a new connection
        const size_t eIdx = vecTaxiEdges.size()-1;
        a.vecEdges.push_back(eIdx);
        b.vecEdges.push_back(eIdx);
        
        return eIdx;
    }